

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O2

CNscPStackEntry * NscBuildDeclarationList(CNscPStackEntry *pList,CNscPStackEntry *pDeclaration)

{
  if (pList == (CNscPStackEntry *)0x0) {
    pList = CNscContext::GetPStackEntryInt(g_pCtx);
    CNscPStackEntry::SetType(pList,NscType_Unknown);
  }
  if ((pDeclaration == (CNscPStackEntry *)0x0) || (pList->m_nType == NscType_Error)) {
    if (pDeclaration == (CNscPStackEntry *)0x0) {
      return pList;
    }
  }
  else if (pDeclaration->m_nType == NscType_Error) {
    CNscPStackEntry::SetType(pList,NscType_Error);
  }
  else {
    CNscPStackEntry::AppendData(pList,pDeclaration->m_pauchData,pDeclaration->m_nDataSize);
  }
  CNwnDoubleLinkList::InsertAfter(&pDeclaration->m_link,&g_pCtx->m_listEntryFree);
  return pList;
}

Assistant:

YYSTYPE NscBuildDeclarationList (YYSTYPE pList, YYSTYPE pDeclaration)
{
	CNscPStackEntry *pOut = pList;

	//
	// If there isn't an list, then create
	//

	if (pOut == NULL)
	{
		pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
		pOut ->SetType (NscType_Unknown);
	}

	//
	// Process the declaration
	//

	if (pOut ->GetType () != NscType_Error)
	{
		if (pDeclaration)
		{
			if (pDeclaration ->GetType () != NscType_Error)
			{
				pOut ->AppendData (pDeclaration ->GetData (),
					pDeclaration ->GetDataSize ());
			}
			else
				pOut ->SetType (NscType_Error);
		}
	}
	if (pDeclaration)
	    g_pCtx ->FreePStackEntry (pDeclaration);

	//
	// Return the new expression
	//

	return pOut;
}